

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O0

void autocovar_fft(auto_fft_object obj,double *vec,double *acov,int M)

{
  int iVar1;
  int N_00;
  double *inp;
  double *oup;
  fft_data *oup_00;
  fft_data *inp_00;
  double dVar2;
  fft_data *bo;
  fft_data *ao;
  double *b;
  double *a;
  double m;
  int N2;
  int L;
  int N;
  int i;
  int M_local;
  double *acov_local;
  double *vec_local;
  auto_fft_object obj_local;
  
  iVar1 = obj->clen;
  N_00 = obj->ilen;
  if (iVar1 < M) {
    N = iVar1 + -1;
    printf(
          "\n Lag is greater than the length N of the input vector. It is automatically set to length N - 1.\n"
          );
    printf("\n The Output Vector only contains N calculated values.");
  }
  else {
    N = M;
    if (M < 0) {
      N = 0;
    }
  }
  inp = (double *)malloc((long)iVar1 << 4);
  oup = (double *)malloc((long)iVar1 << 4);
  oup_00 = (fft_data *)malloc((long)iVar1 << 4);
  inp_00 = (fft_data *)malloc((long)iVar1 << 4);
  dVar2 = mean(vec,N_00);
  for (L = 0; L < iVar1; L = L + 1) {
    if (L < N_00) {
      inp[L] = vec[L] - dVar2;
    }
    else {
      inp[L] = 0.0;
    }
  }
  fft_r2c_exec(obj->fobj,inp,oup_00);
  for (L = 0; L < iVar1; L = L + 1) {
    inp_00[L].re = oup_00[L].re * oup_00[L].re + oup_00[L].im * oup_00[L].im;
    inp_00[L].im = 0.0;
  }
  fft_c2r_exec(obj->iobj,inp_00,oup);
  for (L = 0; L < N; L = L + 1) {
    acov[L] = oup[L] / (double)(iVar1 * N_00);
  }
  free(inp);
  free(oup);
  free(oup_00);
  free(inp_00);
  return;
}

Assistant:

void autocovar_fft(auto_fft_object obj,double* vec,double* acov, int M) {
	int i,N,L,N2;
	double m;
	fft_type* a;
	fft_type* b;
	fft_data* ao;
	fft_data* bo;
	
	N = obj->clen;
	L = obj->ilen;
	N2 = N * L;
	if (M > N) {
		M = N - 1;
		printf("\n Lag is greater than the length N of the input vector. It is automatically set to length N - 1.\n");
		printf("\n The Output Vector only contains N calculated values.");
	}
	else if (M < 0) {
		M = 0;
	}
	
	a = (fft_type*) malloc (sizeof(fft_data) * N);
	b = (fft_type*) malloc (sizeof(fft_data) * N);
	ao = (fft_data*) malloc (sizeof(fft_data) * N);
	bo = (fft_data*) malloc (sizeof(fft_data) * N);
	
	m = mean(vec,L);
	
	for (i = 0; i < N;i++) {
		if (i < L) {
			a[i] = vec[i] - m;
		} else {
			a[i] = 0.0;
		}
	
	}
	
	fft_r2c_exec(obj->fobj,a,ao);
	
	for (i = 0; i < N;i++) {
		bo[i].re = ao[i].re * ao[i].re + ao[i].im * ao[i].im;
		bo[i].im = 0.0;
	}
	
	fft_c2r_exec(obj->iobj,bo,b);
	
	for (i = 0; i < M;i++) {
		acov[i] = b[i]/N2;
	}
	
	free(a);
	free(b);
	free(ao);
	free(bo);

}